

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O3

long julian(long date)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar4 = date + -0x16761;
  lVar2 = -0x5c;
  uVar3 = 0x5c;
  lVar5 = -0x168ce;
  lVar6 = 0x168cd;
  while( true ) {
    if ((uVar3 & 3) == 0) {
      uVar1 = (ulong)((uVar3 / 100) * 100 + lVar2 != 0);
    }
    else {
      uVar1 = 0;
    }
    lVar4 = lVar4 + lVar6 + -0x16c;
    if (lVar4 <= (long)(lVar6 + uVar1)) break;
    lVar4 = lVar4 + (lVar5 - uVar1);
    lVar2 = lVar2 + -1;
    uVar3 = uVar3 + 1;
    lVar5 = lVar5 + -1000;
    lVar6 = lVar6 + 1000;
  }
  return lVar4;
}

Assistant:

long
julian(long date)
{
    long       offset;
    long      result;
    long      yr;
    long      yend;

    offset = date - STARTDATE;
    result = STARTDATE;

#ifdef _MSC_VER
/* Disable warning about conditional expression is constant */ 
#pragma warning(disable:4127)
#endif 

    while (1)
        {
#ifdef _MSC_VER
#pragma warning(default:4127)
#endif 
        yr = result / 1000;
        yend = yr * 1000 + 365 + LEAP(yr);
        if (result + offset > yend)   /* overflow into next year */
            {
            offset -= yend - result + 1;
            result += 1000;
            continue;
            }
        else
            break;
        }
    return (result + offset);
}